

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O1

INT VIRTUALGetAllocationType(SIZE_T Index,PCMI pInformation)

{
  if (pInformation != (PCMI)0x0) {
    return (uint)((pInformation->pAllocState[Index >> 3] >> ((uint)Index & 7) & 1) == 0) * 0x1000 +
           0x1000;
  }
  if (PAL_InitializeChakraCoreCalled) {
    return 0x2000;
  }
  abort();
}

Assistant:

static BOOL VIRTUALIsPageCommitted( SIZE_T nBitToRetrieve, CONST PCMI pInformation )
{
    SIZE_T nByteOffset = 0;
    UINT nBitOffset = 0;
    UINT byteMask = 0;

    if ( !pInformation )
    {
        ERROR( "pInformation was NULL!\n" );
        return FALSE;
    }

    nByteOffset = nBitToRetrieve / CHAR_BIT;
    nBitOffset = nBitToRetrieve % CHAR_BIT;

    byteMask = 1 << nBitOffset;

    if ( pInformation->pAllocState[ nByteOffset ] & byteMask )
    {
        return TRUE;
    }
    else
    {
        return FALSE;
    }
}